

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-pile.c
# Opt level: O0

void pile_excise(object **pile,object *obj)

{
  object *poVar1;
  object *poVar2;
  _Bool _Var3;
  object *next;
  object *prev;
  object *obj_local;
  object **pile_local;
  
  poVar1 = obj->prev;
  poVar2 = obj->next;
  _Var3 = pile_contains(*pile,obj);
  if (!_Var3) {
    pile_integrity_fail(*pile,obj,
                        "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/obj-pile.c"
                        ,L'×');
  }
  pile_check_integrity("excise [pre]",*pile,obj);
  if (*pile == obj) {
    if (poVar1 != (object *)0x0) {
      pile_integrity_fail(*pile,obj,
                          "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/obj-pile.c"
                          ,L'Þ');
    }
    *pile = poVar2;
  }
  else {
    if (obj->prev == (object *)0x0) {
      pile_integrity_fail(*pile,obj,
                          "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/obj-pile.c"
                          ,L'ä');
    }
    poVar1->next = poVar2;
    obj->prev = (object *)0x0;
  }
  if (poVar2 != (object *)0x0) {
    poVar2->prev = poVar1;
    obj->next = (object *)0x0;
  }
  pile_check_integrity("excise [post]",*pile,(object *)0x0);
  return;
}

Assistant:

void pile_excise(struct object **pile, struct object *obj)
{
	struct object *prev = obj->prev;
	struct object *next = obj->next;

	if (!pile_contains(*pile, obj)) {
		pile_integrity_fail(*pile, obj, __FILE__, __LINE__);
	}
	pile_check_integrity("excise [pre]", *pile, obj);

	/* Special case: unlink top object */
	if (*pile == obj) {
		if (prev) {
			pile_integrity_fail(*pile, obj, __FILE__, __LINE__);
		}

		*pile = next;
	} else {
		if (obj->prev == NULL) {
			pile_integrity_fail(*pile, obj, __FILE__, __LINE__);
		}

		/* Otherwise unlink from the previous */
		prev->next = next;
		obj->prev = NULL;
	}

	/* And then unlink from the next */
	if (next) {
		next->prev = prev;
		obj->next = NULL;
	}

	pile_check_integrity("excise [post]", *pile, NULL);
}